

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringConcat(TranslateToFuzzReader *this)

{
  Expression *left;
  Expression *right;
  StringConcat *pSVar1;
  
  left = makeTrappingRefUse(this,(HeapType)0x50);
  right = makeTrappingRefUse(this,(HeapType)0x50);
  pSVar1 = Builder::makeStringConcat(&this->builder,left,right);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringConcat() {
  auto* left = makeTrappingRefUse(HeapType::string);
  auto* right = makeTrappingRefUse(HeapType::string);
  return builder.makeStringConcat(left, right);
}